

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
* dgrminer::find_maximal_subsets_of_pairs
            (vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             *__return_storage_ptr__,
            vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
            *sets)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  pointer pvVar6;
  bool bVar7;
  pointer psVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  long lVar11;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  *pvVar12;
  ulong uVar13;
  pointer pvVar14;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  __normal_iterator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_*,_std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>
  __i;
  pointer pvVar20;
  _Self __tmp;
  ulong uVar21;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  vectors;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  bucket;
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  buckets;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  newbucked;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  output;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> currentSet;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  testBucket;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> testSet;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_138;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_118;
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  local_f8;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_d8;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_b8;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  *local_98;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> local_90;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_78;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> local_48;
  
  local_b8.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar8 = (sets->
           super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98 = __return_storage_ptr__;
  if ((sets->
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    uVar10 = 0;
    do {
      local_118.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var9 = psVar8[uVar10]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar8 = (sets->
               super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      while (p_Var9 != &psVar8[uVar10]._M_t._M_impl.super__Rb_tree_header._M_header) {
        if (local_118.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_118.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>::
          _M_realloc_insert<dgrminer::int_pair_const&>
                    ((vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>> *)&local_118,
                     (iterator)
                     local_118.
                     super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(int_pair *)(p_Var9 + 1));
        }
        else {
          *(int_pair *)
           local_118.
           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = *(int_pair *)(p_Var9 + 1);
          local_118.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_118.
                               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        psVar8 = (sets->
                 super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back(&local_138,(value_type *)&local_118);
      if (local_118.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar10 = uVar10 + 1;
      psVar8 = (sets->
               super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)(((long)(sets->
                                     super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4
                              ) * -0x5555555555555555));
  }
  pvVar6 = local_138.
           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar14 = local_138.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)local_138.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_138.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (lVar11 >> 3) * -0x5555555555555555;
  if (uVar10 < 2) {
    (local_98->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_138.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_98->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_138.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_98->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_138.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_138.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar12 = local_98;
  }
  else {
    if (local_138.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar3 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                (local_138.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_138.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar11 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                  (pvVar14,pvVar6);
      }
      else {
        pvVar20 = pvVar14 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                  (pvVar14,pvVar20);
        for (; pvVar20 != pvVar6; pvVar20 = pvVar20 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Val_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                    (pvVar20);
        }
      }
    }
    local_118.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_138.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_138.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar21 = (ulong)((long)((local_138.
                               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)((local_138.
                              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3;
      lVar11 = 0;
      uVar10 = 0;
      do {
        uVar13 = *(long *)((long)&((local_138.
                                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + lVar11) -
                 *(long *)((long)&((local_138.
                                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar11) >> 3;
        if (uVar13 == (long)(int)uVar21) {
          std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::push_back(&local_118,
                      (value_type *)
                      ((long)&((local_138.
                                super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11));
        }
        else {
          std::
          vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
          ::push_back(&local_f8,&local_118);
          local_d8.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::operator=(&local_118,&local_d8);
          std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::push_back(&local_118,
                      (value_type *)
                      ((long)&((local_138.
                                super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11));
          std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::~vector(&local_d8);
          uVar21 = uVar13 & 0xffffffff;
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x18;
      } while (uVar10 < (ulong)(((long)local_138.
                                       super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_138.
                                       super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    std::
    vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
    ::push_back(&local_f8,&local_118);
    pvVar14 = ((local_f8.
                super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((local_f8.
          super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar14) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::push_back(&local_b8,
                    (value_type *)
                    ((long)&(pvVar14->
                            super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar11));
        uVar10 = uVar10 + 1;
        pvVar14 = ((local_f8.
                    super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x18;
      } while (uVar10 < (ulong)(((long)((local_f8.
                                         super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14
                                >> 3) * -0x5555555555555555));
    }
    if (1 < (ulong)(((long)local_f8.
                           super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_f8.
                           super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      uVar10 = 1;
      do {
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::vector(&local_d8,
                 local_f8.
                 super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10);
        if (local_d8.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_d8.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar21 = 0;
          local_58 = uVar10;
          do {
            std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                      (&local_90,
                       local_d8.
                       super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar21);
            if (local_90.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_90.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              bVar5 = true;
              bVar4 = true;
              uVar13 = 0;
              local_60 = uVar21;
              do {
                local_50 = uVar13;
                std::
                vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                ::vector(&local_78,
                         local_f8.
                         super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar13);
                if (local_78.
                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_78.
                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  uVar10 = 0;
                  do {
                    std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                              (&local_48,
                               local_78.
                               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar10);
                    if ((long)local_90.
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_90.
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar21 = (long)local_90.
                                     super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_90.
                                     super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar13 = (long)local_48.
                                     super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_48.
                                     super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar15 = 0;
                      uVar19 = 0;
                      bVar17 = false;
                      iVar16 = 0;
                      do {
                        uVar18 = (ulong)(int)uVar19;
                        if (uVar18 < uVar13) {
                          iVar1 = local_90.
                                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15].first;
                          do {
                            iVar2 = local_48.
                                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar18].first;
                            bVar7 = true;
                            if ((iVar1 < iVar2) ||
                               ((iVar1 == iVar2 &&
                                (local_90.
                                 super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar15].second <
                                 local_48.
                                 super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar18].second)))) break;
                            if ((iVar1 == iVar2) &&
                               (local_90.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar15].second ==
                                local_48.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar18].second)) {
                              iVar16 = iVar16 + 1;
                              bVar4 = bVar5;
                              if (uVar21 == (long)iVar16) {
                                bVar4 = false;
                                bVar17 = true;
                              }
                              uVar19 = uVar18 & 0xffffffff;
                              bVar5 = bVar4;
                              goto LAB_00157d02;
                            }
                            uVar18 = uVar18 + 1;
                            bVar7 = bVar17;
                          } while (uVar18 < uVar13);
                          bVar17 = bVar7;
                          uVar19 = uVar18 & 0xffffffff;
                        }
LAB_00157d02:
                      } while ((!bVar17) && (uVar15 = uVar15 + 1, uVar15 < uVar21));
                    }
                    if (local_48.
                        super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_48.
                                      super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                  } while ((bVar4) &&
                          (uVar10 = uVar10 + 1,
                          uVar21 = ((long)local_78.
                                          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.
                                          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555, uVar10 <= uVar21 && uVar21 - uVar10 != 0));
                }
                std::
                vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                ::~vector(&local_78);
                uVar10 = local_58;
                uVar21 = local_60;
              } while ((bVar4) && (uVar13 = local_50 + 1, uVar13 < local_58));
              if (bVar4) {
                std::
                vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                ::push_back(&local_b8,&local_90);
              }
            }
            if (local_90.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar21 = uVar21 + 1;
            uVar13 = ((long)local_d8.
                            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_d8.
                            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          } while (uVar21 <= uVar13 && uVar13 - uVar21 != 0);
        }
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::~vector(&local_d8);
        uVar10 = uVar10 + 1;
        uVar21 = ((long)local_f8.
                        super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_f8.
                        super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar10 <= uVar21 && uVar21 - uVar10 != 0);
    }
    pvVar12 = local_98;
    (local_98->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_b8.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_98->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_98->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::~vector(&local_118);
  }
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector(&local_138);
  std::
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector(&local_b8);
  return pvVar12;
}

Assistant:

std::vector<std::vector<int_pair>> find_maximal_subsets_of_pairs(std::vector<std::set<int_pair>> sets)
    {
        std::vector<std::vector<int_pair>> output;
        std::vector<std::vector<std::vector<int_pair>>> buckets;

        // transform sets into vectors:
        std::vector<std::vector<int_pair>> vectors;
        for (size_t i = 0; i < sets.size(); i++)
        {
            std::vector<int_pair> vec;
            for (std::set<int_pair>::iterator j = sets[i].begin(); j != sets[i].end(); j++)
            {
                vec.push_back(*j);
            }
            vectors.push_back(vec);
        }


        if (vectors.size() <= 1)
        { return vectors; }

        // sort the vector by descending length
        std::sort(vectors.begin(), vectors.end(),
                  [](std::vector<int_pair> x, std::vector<int_pair> y) -> int { return (x.size() > y.size()); });


        int length = vectors[0].size();
        std::vector<std::vector<int_pair>> bucket;//current bucket
        //Place each set with shared length in its own bucket
        for (size_t i = 0; i < vectors.size(); i++)
        {
            if (vectors[i].size() == length)//current Bucket
            {
                bucket.push_back(vectors[i]);
            }
            else//new Bucket
            {
                length = vectors[i].size();
                buckets.push_back(bucket);
                std::vector<std::vector<int_pair>> newbucked;
                bucket = newbucked;
                bucket.push_back(vectors[i]);
            }
        }
        buckets.push_back(bucket);

        //Based on the assumption of uniqueness, everything in the first bucket is
        //larger than every other set and since it is unique, they are not proper subsets
        for (size_t i = 0; i < buckets[0].size(); i++)
        {
            output.push_back(buckets[0][i]);
        }

        //Iterate through the buckets
        for (int i = 1; i < buckets.size(); i++)
        {
            std::vector<std::vector<int_pair>> currentBucket = buckets[i];

            //Iterate through the sets in the current bucket
            for (int a = 0; a < currentBucket.size(); a++)
            {
                std::vector<int_pair> currentSet = currentBucket[a]; // this set can be potentially added


                // if the current set is empty and we got here, then there is another set which is a superset of this empty set
                if (currentSet.size() == 0)
                { continue; }

                bool addSet = true;

                //Iterate through buckets with greater length
                for (int b = 0; b < i; b++)
                {
                    std::vector<std::vector<int_pair>> testBucket = buckets[b]; // here can be potentially a super set of the currentSet


                    //Iterate through the sets in testBucket
                    for (int c = 0; c < testBucket.size(); c++)
                    {
                        std::vector<int_pair> testSet = testBucket[c]; // this can be potentially a super set of the currentSet
                        int testMatches = 0;

                        bool setClear = false; // my addition
                        int testIndex = 0;
                        //Iterate through the values in the current set
                        for (int d = 0; d < currentSet.size(); d++)
                        {

                            //Iterate through the values in the test set
                            for (; testIndex < testSet.size(); testIndex++)
                            {
                                if (currentSet[d] < testSet[testIndex])
                                {
                                    setClear = true;
                                    break;
                                }
                                if (currentSet[d] == testSet[testIndex])
                                {
                                    testMatches++;
                                    if (testMatches == currentSet.size())
                                    {
                                        // SAME LENGTH
                                        addSet = false;
                                        setClear = true;
                                    }
                                    break;
                                }
                            }//testIndex
                            if (setClear)
                            { break; }
                        }//d
                        if (!addSet)
                        { break; }
                    }//c
                    if (!addSet)
                    { break; }
                }//b
                if (addSet)
                { output.push_back(currentSet); }
            }//a
        }//i


        return output;
    }